

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O1

void __thiscall tf::NonblockingNotifierV2::_notify<true>(NonblockingNotifierV2 *this)

{
  uint uVar1;
  ulong uVar2;
  __int_type_conflict _Var3;
  bool bVar4;
  
  _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
  do {
    do {
      uVar1 = (uint)(_Var3 >> 0xe) & 0x3fff;
      if (((~(uint)_Var3 & 0x3fff) == 0) && (uVar1 == ((uint)(_Var3 >> 0x1c) & 0x3fff))) {
        return;
      }
      LOCK();
      uVar2 = (this->_state).super___atomic_base<unsigned_long>._M_i;
      bVar4 = _Var3 == uVar2;
      if (bVar4) {
        (this->_state).super___atomic_base<unsigned_long>._M_i =
             (ulong)((uint)_Var3 & 0xfffc000) + (ulong)uVar1 * 0x10000000 + 0x3fff;
        uVar2 = _Var3;
      }
      UNLOCK();
      _Var3 = uVar2;
    } while (!bVar4);
    if ((uVar2 & 0x3fff) != 0x3fff) {
      _unpark(this,(Waiter *)
                   ((long)&(((this->_waiters).
                             super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                             ._M_impl.super__Vector_impl_data._M_start)->next).
                           super___atomic_base<unsigned_long>._M_i +
                   (ulong)(uint)((int)(uVar2 & 0x3fff) << 7)));
    }
  } while (!bVar4);
  return;
}

Assistant:

void _notify() {
    std::atomic_thread_fence(std::memory_order_seq_cst);
    uint64_t state = _state.load(std::memory_order_acquire);
    for (;;) {
      //_check_state(state);
      const uint64_t waiters = (state & kWaiterMask) >> kWaiterShift;
      const uint64_t signals = (state & kSignalMask) >> kSignalShift;
      // Easy case: no waiters.
      if ((state & kStackMask) == kStackMask && waiters == signals) return;
      uint64_t newstate;
      if (notifyAll) {
        // Empty wait stack and set signal to number of pre-wait threads.
        newstate = (state & kWaiterMask) | (waiters << kSignalShift) | kStackMask;
      } else if (signals < waiters) {
        // There is a thread in pre-wait state, unblock it.
        newstate = state + kSignalInc;
      } else {
        // Pop a waiter from list and unpark it.
        Waiter* w = &_waiters[state & kStackMask];
        uint64_t next = w->next.load(std::memory_order_relaxed);
        newstate = (state & (kWaiterMask | kSignalMask)) | next;
      }
      //_check_state(newstate);
      if (_state.compare_exchange_weak(state, newstate, std::memory_order_acq_rel)) {
        if (!notifyAll && (signals < waiters)) return;  // unblocked pre-wait thread
        if ((state & kStackMask) == kStackMask) return;
        Waiter* w = &_waiters[state & kStackMask];
        if (!notifyAll) w->next.store(kStackMask, std::memory_order_relaxed);
        _unpark(w);
        return;
      }
    }
  }